

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.c
# Opt level: O1

void assert_double_equal_(char *file,int line,char *expression,double tried,double expected)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _Bool _Var2;
  int iVar3;
  TestReporter *pTVar4;
  
  pTVar4 = get_test_reporter();
  p_Var1 = pTVar4->assert_true;
  pTVar4 = get_test_reporter();
  _Var2 = doubles_are_equal(tried,expected);
  iVar3 = get_significant_figures();
  (*p_Var1)(pTVar4,file,line,(uint)_Var2,
            "[%s] should be [%f] within %d significant figures but was [%f]\n",expected,tried,
            expression,iVar3);
  return;
}

Assistant:

void assert_double_equal_(const char *file, int line, const char *expression, double tried, double expected) {
    (*get_test_reporter()->assert_true)(
            get_test_reporter(),
            file,
            line,
            doubles_are_equal(tried, expected),
            "[%s] should be [%f] within %d significant figures but was [%f]\n", expression, expected, get_significant_figures(), tried);
}